

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::ChompSetBoundedInst::Print
          (ChompSetBoundedInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x31);
  }
  DebugWriter::Print(w,L"ChompSetBounded");
  DebugWriter::Print(w,L"(");
  SetMixin<false>::Print(&this->super_SetMixin<false>,w,litbuf);
  DebugWriter::Print(w,L", ");
  ChompBoundedMixin::Print(&this->super_ChompBoundedMixin,w,litbuf_00);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::ChompBoundedMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_ChompBoundedMixin,
               L"ChompBoundedMixin");
    DebugWriter::Unindent(w);
  }
  return 0x31;
}

Assistant:

int ChompSetBoundedInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("ChompSetBounded");
        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN(ChompBoundedMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(ChompBoundedMixin);
        PRINT_RE_BYTECODE_END();
    }